

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_6_2_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float *data;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  int c1_1;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  int c2;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  float *pfVar47;
  int c2_1;
  int iVar48;
  long lVar49;
  int iVar50;
  float *pfVar51;
  float *pfVar52;
  long lVar53;
  long lVar54;
  int iVar55;
  int iVar56;
  int k_count;
  long lVar57;
  long lVar58;
  long lVar59;
  int c1;
  int iVar60;
  long lVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [64];
  undefined1 auVar104 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  int data_width;
  
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar103 = ZEXT1664(auVar75);
  fVar82 = ipoint->scale;
  auVar107 = ZEXT464((uint)fVar82);
  auVar67 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)fVar82),auVar74,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  iVar44 = (int)auVar67._0_4_;
  fVar80 = -0.08 / (fVar82 * fVar82);
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->x),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->x + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69._0_8_ = (double)auVar68._0_4_;
  auVar69._8_8_ = auVar68._8_8_;
  auVar73._0_8_ = (double)fVar82;
  auVar73._8_8_ = 0;
  auVar68 = vfmadd231sd_fma(auVar69,auVar73,ZEXT816(0x3fe0000000000000));
  auVar72._0_4_ = (float)auVar68._0_8_;
  auVar72._4_12_ = auVar68._4_12_;
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->y),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->y + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70._0_8_ = (double)auVar68._0_4_;
  auVar70._8_8_ = auVar68._8_8_;
  auVar68 = vfmadd231sd_fma(auVar70,auVar73,ZEXT816(0x3fe0000000000000));
  auVar71._0_4_ = (float)auVar68._0_8_;
  auVar71._4_12_ = auVar68._4_12_;
  auVar68._0_4_ = (int)auVar67._0_4_;
  auVar68._4_4_ = (int)auVar67._4_4_;
  auVar68._8_4_ = (int)auVar67._8_4_;
  auVar68._12_4_ = (int)auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar68);
  fVar7 = auVar72._0_4_ - auVar67._0_4_;
  fVar8 = auVar71._0_4_ - auVar67._0_4_;
  auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar82),auVar72);
  auVar68 = vpternlogd_avx512vl(auVar75,auVar67,auVar74,0xf8);
  auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar68._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = ZEXT416((uint)fVar82);
  if (iVar44 < (int)auVar67._0_4_) {
    auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar68,auVar71);
    auVar76._8_4_ = 0x3effffff;
    auVar76._0_8_ = 0x3effffff3effffff;
    auVar76._12_4_ = 0x3effffff;
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    auVar69 = vpternlogd_avx512vl(auVar77,auVar67,auVar76,0xea);
    auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
    auVar67 = vroundss_avx(auVar67,auVar67,0xb);
    if (iVar44 < (int)auVar67._0_4_) {
      auVar67 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar69 = vpternlogd_avx512vl(auVar78,auVar67,auVar76,0xea);
      auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
      auVar67 = vroundss_avx(auVar67,auVar67,0xb);
      if ((int)auVar67._0_4_ + iVar44 <= iimage->width) {
        auVar67 = vfmadd231ss_fma(auVar71,auVar68,ZEXT416(0x41300000));
        auVar18._8_4_ = 0x80000000;
        auVar18._0_8_ = 0x8000000080000000;
        auVar18._12_4_ = 0x80000000;
        auVar69 = vpternlogd_avx512vl(auVar76,auVar67,auVar18,0xf8);
        auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
        auVar67 = vroundss_avx(auVar67,auVar67,0xb);
        if ((int)auVar67._0_4_ + iVar44 <= iimage->height) {
          fVar8 = fVar8 + 0.5;
          pfVar51 = iimage->data;
          iVar1 = iimage->data_width;
          iVar24 = iVar44 * 2;
          pfVar52 = haarResponseY + 0x79;
          pfVar47 = haarResponseX + 0x79;
          uVar27 = 0xfffffff4;
          do {
            auVar67._0_4_ = (float)(int)uVar27;
            auVar104 = in_ZMM8._4_12_;
            auVar67._4_12_ = auVar104;
            auVar67 = vfmadd213ss_fma(auVar67,auVar68,ZEXT416((uint)fVar8));
            iVar40 = (int)auVar67._0_4_;
            auVar92._0_4_ = (float)(int)(uVar27 | 1);
            auVar92._4_12_ = auVar104;
            auVar67 = vfmadd213ss_fma(auVar92,auVar68,ZEXT416((uint)fVar8));
            iVar32 = (int)auVar67._0_4_;
            auVar93._0_4_ = (float)(int)(uVar27 + 2);
            auVar93._4_12_ = auVar104;
            auVar69 = ZEXT416((uint)fVar8);
            auVar67 = vfmadd213ss_fma(auVar93,auVar68,auVar69);
            iVar31 = (int)auVar67._0_4_;
            auVar94._0_4_ = (float)(int)(uVar27 + 3);
            auVar94._4_12_ = auVar104;
            auVar67 = vfmadd213ss_fma(auVar94,auVar68,auVar69);
            iVar42 = (int)auVar67._0_4_;
            auVar95._0_4_ = (float)(int)(uVar27 + 4);
            auVar95._4_12_ = auVar104;
            auVar67 = vfmadd213ss_fma(auVar95,auVar68,auVar69);
            iVar23 = (int)auVar67._0_4_;
            auVar96._0_4_ = (float)(int)(uVar27 + 5);
            auVar96._4_12_ = auVar104;
            auVar67 = vfmadd213ss_fma(auVar96,auVar68,auVar69);
            iVar55 = (iVar40 + -1) * iVar1;
            iVar63 = (iVar40 + -1 + iVar44) * iVar1;
            iVar65 = (iVar40 + -1 + iVar24) * iVar1;
            iVar62 = (iVar32 + -1) * iVar1;
            iVar45 = (iVar32 + -1 + iVar44) * iVar1;
            iVar64 = (iVar32 + -1 + iVar24) * iVar1;
            iVar40 = (iVar31 + -1) * iVar1;
            iVar36 = (iVar31 + -1 + iVar44) * iVar1;
            iVar56 = (iVar31 + -1 + iVar24) * iVar1;
            iVar26 = (iVar42 + -1) * iVar1;
            iVar41 = (iVar42 + -1 + iVar44) * iVar1;
            iVar25 = (iVar42 + -1 + iVar24) * iVar1;
            iVar31 = (iVar23 + -1) * iVar1;
            iVar42 = (iVar23 + -1 + iVar44) * iVar1;
            iVar33 = (iVar23 + -1 + iVar24) * iVar1;
            iVar23 = (int)auVar67._0_4_;
            iVar32 = (iVar23 + -1) * iVar1;
            iVar43 = (iVar23 + -1 + iVar44) * iVar1;
            iVar23 = (iVar23 + -1 + iVar24) * iVar1;
            lVar58 = 0;
            do {
              iVar28 = (int)lVar58 + -0xc;
              auVar97._0_4_ = (float)iVar28;
              auVar97._4_12_ = auVar75._4_12_;
              auVar67 = vfmadd213ss_fma(auVar97,auVar68,ZEXT416((uint)(fVar7 + 0.5)));
              iVar50 = (int)auVar67._0_4_;
              auVar98._0_4_ = (float)((int)lVar58 + -0xb);
              auVar98._4_12_ = auVar75._4_12_;
              auVar67 = vfmadd213ss_fma(auVar98,auVar68,ZEXT416((uint)(fVar7 + 0.5)));
              iVar37 = (int)auVar67._0_4_;
              iVar60 = iVar50 + -1 + iVar44;
              iVar39 = iVar50 + -1 + iVar24;
              fVar82 = pfVar51[iVar63 + -1 + iVar50];
              fVar81 = pfVar51[iVar65 + -1 + iVar50];
              fVar100 = pfVar51[iVar65 + iVar39];
              fVar9 = pfVar51[iVar55 + -1 + iVar50];
              fVar10 = pfVar51[iVar55 + iVar39];
              auVar69 = SUB6416(ZEXT464(0x40000000),0);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar55 + iVar60] -
                                                      pfVar51[iVar65 + iVar60])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar63 + iVar39];
              pfVar47[lVar58 + -0x79] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              iVar34 = iVar37 + -1 + iVar44;
              iVar48 = iVar37 + -1 + iVar24;
              pfVar52[lVar58 + -0x79] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar63 + -1 + iVar37];
              fVar81 = pfVar51[iVar65 + -1 + iVar37];
              fVar100 = pfVar51[iVar65 + iVar48];
              fVar9 = pfVar51[iVar55 + -1 + iVar37];
              fVar10 = pfVar51[iVar55 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar55 + iVar34] -
                                                      pfVar51[iVar65 + iVar34])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar63 + iVar48];
              pfVar47[lVar58 + -0x78] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x78] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar45 + -1 + iVar50];
              fVar81 = pfVar51[iVar64 + -1 + iVar50];
              fVar100 = pfVar51[iVar64 + iVar39];
              fVar9 = pfVar51[iVar62 + -1 + iVar50];
              fVar10 = pfVar51[iVar62 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar62 + iVar60] -
                                                      pfVar51[iVar64 + iVar60])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar45 + iVar39];
              pfVar47[lVar58 + -0x61] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x61] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar45 + -1 + iVar37];
              fVar81 = pfVar51[iVar64 + -1 + iVar37];
              fVar100 = pfVar51[iVar64 + iVar48];
              fVar9 = pfVar51[iVar62 + -1 + iVar37];
              fVar10 = pfVar51[iVar62 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar62 + iVar34] -
                                                      pfVar51[iVar64 + iVar34])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar45 + iVar48];
              pfVar47[lVar58 + -0x60] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x60] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar36 + -1 + iVar50];
              fVar81 = pfVar51[iVar56 + -1 + iVar50];
              fVar100 = pfVar51[iVar56 + iVar39];
              fVar9 = pfVar51[iVar40 + -1 + iVar50];
              fVar10 = pfVar51[iVar40 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar40 + iVar60] -
                                                      pfVar51[iVar56 + iVar60])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar36 + iVar39];
              pfVar47[lVar58 + -0x49] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x49] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar36 + -1 + iVar37];
              fVar81 = pfVar51[iVar56 + -1 + iVar37];
              fVar100 = pfVar51[iVar56 + iVar48];
              fVar9 = pfVar51[iVar40 + -1 + iVar37];
              fVar10 = pfVar51[iVar40 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar40 + iVar34] -
                                                      pfVar51[iVar56 + iVar34])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar36 + iVar48];
              pfVar47[lVar58 + -0x48] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x48] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar41 + -1 + iVar50];
              fVar81 = pfVar51[iVar25 + -1 + iVar50];
              fVar100 = pfVar51[iVar25 + iVar39];
              fVar9 = pfVar51[iVar26 + -1 + iVar50];
              fVar10 = pfVar51[iVar26 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar26 + iVar60] -
                                                      pfVar51[iVar25 + iVar60])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar41 + iVar39];
              pfVar47[lVar58 + -0x31] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x31] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar41 + -1 + iVar37];
              fVar81 = pfVar51[iVar25 + -1 + iVar37];
              fVar100 = pfVar51[iVar25 + iVar48];
              fVar9 = pfVar51[iVar26 + -1 + iVar37];
              fVar10 = pfVar51[iVar26 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar26 + iVar34] -
                                                      pfVar51[iVar25 + iVar34])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar41 + iVar48];
              pfVar47[lVar58 + -0x30] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x30] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar42 + -1 + iVar50];
              fVar81 = pfVar51[iVar33 + -1 + iVar50];
              fVar100 = pfVar51[iVar33 + iVar39];
              fVar9 = pfVar51[iVar31 + -1 + iVar50];
              fVar10 = pfVar51[iVar31 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar31 + iVar60] -
                                                      pfVar51[iVar33 + iVar60])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar42 + iVar39];
              pfVar47[lVar58 + -0x19] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x19] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar42 + -1 + iVar37];
              fVar81 = pfVar51[iVar33 + -1 + iVar37];
              fVar100 = pfVar51[iVar33 + iVar48];
              fVar9 = pfVar51[iVar31 + -1 + iVar37];
              fVar10 = pfVar51[iVar31 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar31 + iVar34] -
                                                      pfVar51[iVar33 + iVar34])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar42 + iVar48];
              pfVar47[lVar58 + -0x18] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -0x18] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar43 + -1 + iVar50];
              fVar81 = pfVar51[iVar23 + -1 + iVar50];
              fVar100 = pfVar51[iVar39 + iVar23];
              fVar9 = pfVar51[iVar32 + -1 + iVar50];
              fVar10 = pfVar51[iVar32 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar32 + iVar60] -
                                                      pfVar51[iVar60 + iVar23])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              fVar87 = pfVar51[iVar43 + iVar39];
              pfVar47[lVar58 + -1] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58 + -1] = auVar67._0_4_ - (fVar81 - fVar10);
              fVar82 = pfVar51[iVar43 + -1 + iVar37];
              fVar81 = pfVar51[iVar23 + -1 + iVar37];
              fVar100 = pfVar51[iVar48 + iVar23];
              fVar9 = pfVar51[iVar32 + -1 + iVar37];
              fVar10 = pfVar51[iVar32 + iVar48];
              fVar87 = pfVar51[iVar43 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar32 + iVar34] -
                                                      pfVar51[iVar34 + iVar23])),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar47[lVar58] = (fVar81 - fVar10) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar100 - fVar9)));
              pfVar52[lVar58] = auVar67._0_4_ - (fVar81 - fVar10);
              lVar58 = lVar58 + 2;
            } while (iVar28 < 10);
            pfVar52 = pfVar52 + 0x90;
            pfVar47 = pfVar47 + 0x90;
            bVar2 = (int)uVar27 < 6;
            uVar27 = uVar27 + 6;
          } while (bVar2);
          goto LAB_00260057;
        }
      }
    }
  }
  iVar1 = iVar44 * 2;
  lVar58 = 0;
  uVar27 = 0xfffffff4;
  do {
    auVar67 = vpbroadcastd_avx512vl();
    auVar67 = vpaddd_avx(auVar67,_DAT_005766e0);
    auVar85._0_4_ = (float)(int)uVar27;
    auVar85._4_12_ = in_ZMM8._4_12_;
    auVar69 = vfmadd213ss_fma(auVar85,auVar107._0_16_,ZEXT416((uint)fVar8));
    auVar88._0_4_ = (float)(int)(uVar27 | 1);
    auVar88._4_12_ = in_ZMM8._4_12_;
    auVar70 = vfmadd213ss_fma(auVar88,auVar107._0_16_,ZEXT416((uint)fVar8));
    fVar81 = auVar69._0_4_;
    iVar62 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
    fVar81 = auVar70._0_4_;
    auVar67 = vcvtdq2ps_avx(auVar67);
    auVar21._4_4_ = fVar8;
    auVar21._0_4_ = fVar8;
    auVar21._8_4_ = fVar8;
    auVar21._12_4_ = fVar8;
    auVar22._4_4_ = fVar82;
    auVar22._0_4_ = fVar82;
    auVar22._8_4_ = fVar82;
    auVar22._12_4_ = fVar82;
    auVar67 = vfmadd132ps_fma(auVar67,auVar21,auVar22);
    uVar29 = vcmpps_avx512vl(auVar67,_DAT_00576190,0xd);
    auVar6 = vcvtps2pd_avx(auVar67);
    auVar90._8_8_ = 0xbfe0000000000000;
    auVar90._0_8_ = 0xbfe0000000000000;
    auVar90._16_8_ = 0xbfe0000000000000;
    auVar90._24_8_ = 0xbfe0000000000000;
    auVar79._12_4_ = 0x3fe00000;
    auVar79._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar79._16_8_ = 0x3fe0000000000000;
    auVar79._24_8_ = 0x3fe0000000000000;
    auVar79 = vblendmpd_avx512vl(auVar90,auVar79);
    bVar2 = (bool)((byte)uVar29 & 1);
    bVar3 = (bool)((byte)(uVar29 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar29 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar83._0_4_ =
         (int)((double)((ulong)bVar2 * auVar79._0_8_ | (ulong)!bVar2 * -0x4020000000000000) +
              auVar6._0_8_);
    auVar83._4_4_ =
         (int)((double)((ulong)bVar3 * auVar79._8_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar6._8_8_);
    auVar83._8_4_ =
         (int)((double)((ulong)bVar4 * auVar79._16_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar6._16_8_);
    auVar83._12_4_ =
         (int)((double)((ulong)bVar5 * auVar79._24_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar6._24_8_);
    iVar31 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
    iVar40 = iVar62 + -1 + iVar44;
    iVar41 = iVar31 + -1 + iVar44;
    auVar19._8_4_ = 1;
    auVar19._0_8_ = 0x100000001;
    auVar19._12_4_ = 1;
    uVar29 = vpcmpd_avx512vl(auVar83,auVar19,1);
    uVar66 = uVar29 & 0xf;
    iVar32 = auVar83._12_4_ + -1 + iVar44;
    iVar42 = auVar83._8_4_ + -1 + iVar44;
    iVar43 = auVar83._4_4_ + -1 + iVar44;
    iVar23 = auVar83._0_4_ + -1 + iVar44;
    lVar57 = lVar58;
    iVar24 = -0xc;
    do {
      auVar84._0_4_ = (float)iVar24;
      auVar84._4_12_ = auVar103._4_12_;
      auVar67 = vfmadd213ss_fma(auVar84,auVar107._0_16_,ZEXT416((uint)fVar7));
      auVar101._0_4_ = (float)(iVar24 + 1);
      auVar101._4_12_ = auVar103._4_12_;
      auVar69 = vfmadd213ss_fma(auVar101,auVar107._0_16_,ZEXT416((uint)fVar7));
      fVar81 = auVar67._0_4_;
      fVar100 = auVar69._0_4_;
      pfVar51 = (float *)((long)haarResponseY + lVar57);
      iVar36 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
      if ((((iVar62 < 1) || (iVar36 < 1)) || (iimage->height < iVar1 + iVar62)) ||
         (iVar25 = iVar1 + iVar36, iimage->width < iVar25)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar62,iVar36,iVar44,(float *)((long)haarResponseX + lVar57),pfVar51);
      }
      else {
        iVar45 = iVar36 + -1 + iVar44;
        pfVar52 = iimage->data;
        iVar26 = iimage->data_width;
        iVar33 = iVar26 * (iVar62 + -1);
        iVar56 = iVar26 * iVar40;
        fVar81 = pfVar52[iVar56 + -1 + iVar36];
        iVar26 = iVar26 * (iVar1 + -1 + iVar62);
        fVar9 = pfVar52[iVar26 + -1 + iVar36];
        fVar10 = pfVar52[iVar26 + -1 + iVar25];
        fVar87 = pfVar52[iVar33 + -1 + iVar36];
        fVar11 = pfVar52[iVar33 + -1 + iVar25];
        fVar12 = pfVar52[iVar56 + -1 + iVar25];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar45] - pfVar52[iVar26 + iVar45]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar87)));
        *(float *)((long)haarResponseX + lVar57) = (fVar9 - fVar11) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar87)));
        *pfVar51 = auVar67._0_4_ - (fVar9 - fVar11);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar100) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar100) * -0x4020000000000000) + (double)fVar100);
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 4);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 4);
      if (((iVar62 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar1 + iVar62 || (iVar26 = iVar1 + iVar25, iimage->width < iVar26)))) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar62,iVar25,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar25 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (iVar62 + -1);
        iVar55 = iVar33 * iVar40;
        fVar81 = pfVar47[iVar55 + -1 + iVar25];
        iVar33 = iVar33 * (iVar1 + -1 + iVar62);
        fVar100 = pfVar47[iVar33 + -1 + iVar25];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar25];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0x60);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0x60);
      if (((iVar31 < 1) || (iVar36 < 1)) ||
         ((iimage->height < iVar1 + iVar31 || (iVar26 = iVar1 + iVar36, iimage->width < iVar26)))) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar36,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar55 = iVar36 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (iVar31 + -1);
        iVar56 = iVar33 * iVar41;
        fVar81 = pfVar47[iVar56 + -1 + iVar36];
        iVar33 = iVar33 * (iVar1 + -1 + iVar31);
        fVar100 = pfVar47[iVar33 + -1 + iVar36];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar36];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar56 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar55] - pfVar47[iVar33 + iVar55]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 100);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 100);
      if ((((iVar31 < 1) || (iVar25 < 1)) || (iimage->height < iVar1 + iVar31)) ||
         (iVar26 = iVar1 + iVar25, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar25,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar25 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (iVar31 + -1);
        iVar55 = iVar33 * iVar41;
        fVar81 = pfVar47[iVar55 + -1 + iVar25];
        iVar33 = iVar33 * (iVar1 + -1 + iVar31);
        fVar100 = pfVar47[iVar33 + -1 + iVar25];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar25];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0xc0);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0xc0);
      if (((iVar36 < 1 || uVar66 >> 3 != 0) || (iimage->height < iVar1 + auVar83._12_4_)) ||
         (iVar26 = iVar1 + iVar36, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar36,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar36 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (auVar83._12_4_ + -1);
        iVar55 = iVar33 * iVar32;
        fVar81 = pfVar47[iVar55 + -1 + iVar36];
        iVar33 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar100 = pfVar47[iVar33 + -1 + iVar36];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar36];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0xc4);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0xc4);
      if (((iVar25 < 1 || uVar66 >> 3 != 0) || (iimage->height < iVar1 + auVar83._12_4_)) ||
         (iVar26 = iVar1 + iVar25, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar25,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar25 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (auVar83._12_4_ + -1);
        iVar55 = iVar33 * iVar32;
        fVar81 = pfVar47[iVar55 + -1 + iVar25];
        iVar33 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar100 = pfVar47[iVar33 + -1 + iVar25];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar25];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0x120);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0x120);
      if (((iVar36 < 1 || (uVar66 >> 2 & 1) != 0) || (iimage->height < iVar1 + auVar83._8_4_)) ||
         (iVar26 = iVar1 + iVar36, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar36,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar36 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (auVar83._8_4_ + -1);
        iVar55 = iVar33 * iVar42;
        fVar81 = pfVar47[iVar55 + -1 + iVar36];
        iVar33 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar100 = pfVar47[iVar33 + -1 + iVar36];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar36];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0x124);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0x124);
      if (((iVar25 < 1 || (uVar66 >> 2 & 1) != 0) || (iimage->height < iVar1 + auVar83._8_4_)) ||
         (iVar26 = iVar1 + iVar25, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar25,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar25 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (auVar83._8_4_ + -1);
        iVar55 = iVar33 * iVar42;
        fVar81 = pfVar47[iVar55 + -1 + iVar25];
        iVar33 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar100 = pfVar47[iVar33 + -1 + iVar25];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar25];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0x180);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0x180);
      if (((iVar36 < 1 || (uVar66 >> 1 & 1) != 0) || (iimage->height < iVar1 + auVar83._4_4_)) ||
         (iVar26 = iVar1 + iVar36, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar36,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar36 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (auVar83._4_4_ + -1);
        iVar55 = iVar33 * iVar43;
        fVar81 = pfVar47[iVar55 + -1 + iVar36];
        iVar33 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar100 = pfVar47[iVar33 + -1 + iVar36];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar36];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0x184);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0x184);
      if (((iVar25 < 1 || (uVar66 >> 1 & 1) != 0) || (iimage->height < iVar1 + auVar83._4_4_)) ||
         (iVar26 = iVar1 + iVar25, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar25,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar56 = iVar25 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar45 = iVar33 * (auVar83._4_4_ + -1);
        iVar55 = iVar33 * iVar43;
        fVar81 = pfVar47[iVar55 + -1 + iVar25];
        iVar33 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar100 = pfVar47[iVar33 + -1 + iVar25];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar45 + -1 + iVar25];
        fVar87 = pfVar47[iVar45 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar56] - pfVar47[iVar33 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0x1e0);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0x1e0);
      if (((iVar36 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar1 + auVar83._0_4_)) ||
         (iVar26 = iVar1 + iVar36, iimage->width < iVar26)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar36,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar45 = iVar36 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar33 = iimage->data_width;
        iVar56 = iVar33 * (auVar83._0_4_ + -1);
        iVar55 = iVar33 * iVar23;
        fVar81 = pfVar47[iVar55 + -1 + iVar36];
        iVar33 = iVar33 * (iVar1 + -1 + auVar83._0_4_);
        fVar100 = pfVar47[iVar33 + -1 + iVar36];
        fVar9 = pfVar47[iVar33 + -1 + iVar26];
        fVar10 = pfVar47[iVar56 + -1 + iVar36];
        fVar87 = pfVar47[iVar56 + -1 + iVar26];
        fVar11 = pfVar47[iVar55 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar56 + iVar45] - pfVar47[iVar33 + iVar45]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      pfVar51 = (float *)((long)haarResponseX + lVar57 + 0x1e4);
      pfVar52 = (float *)((long)haarResponseY + lVar57 + 0x1e4);
      if (((iVar25 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar1 + auVar83._0_4_)) ||
         (iVar36 = iVar1 + iVar25, iimage->width < iVar36)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar25,iVar44,pfVar51,pfVar52);
      }
      else {
        iVar33 = iVar25 + -1 + iVar44;
        pfVar47 = iimage->data;
        iVar26 = iimage->data_width;
        iVar45 = iVar26 * (auVar83._0_4_ + -1);
        iVar56 = iVar26 * iVar23;
        fVar81 = pfVar47[iVar56 + -1 + iVar25];
        iVar26 = iVar26 * (iVar1 + -1 + auVar83._0_4_);
        fVar100 = pfVar47[iVar26 + -1 + iVar25];
        fVar9 = pfVar47[iVar26 + -1 + iVar36];
        fVar10 = pfVar47[iVar45 + -1 + iVar25];
        fVar87 = pfVar47[iVar45 + -1 + iVar36];
        fVar11 = pfVar47[iVar56 + -1 + iVar36];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar45 + iVar33] - pfVar47[iVar26 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar51 = (fVar100 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = auVar67._0_4_ - (fVar100 - fVar87);
      }
      auVar107 = ZEXT1664(auVar68);
      lVar57 = lVar57 + 8;
      bVar2 = iVar24 < 10;
      iVar24 = iVar24 + 2;
    } while (bVar2);
    lVar58 = lVar58 + 0x240;
    bVar2 = (int)uVar27 < 6;
    uVar27 = uVar27 + 6;
  } while (bVar2);
LAB_00260057:
  fVar82 = auVar107._0_4_;
  auVar106._8_4_ = 0x3effffff;
  auVar106._0_8_ = 0x3effffff3effffff;
  auVar106._12_4_ = 0x3effffff;
  auVar105._8_4_ = 0x80000000;
  auVar105._0_8_ = 0x8000000080000000;
  auVar105._12_4_ = 0x80000000;
  auVar67 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 0.5)),auVar105,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 * 0.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 1.5)),auVar105,0xf8);
  auVar68 = ZEXT416((uint)(fVar82 * 1.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 2.5)),auVar105,0xf8);
  auVar69 = ZEXT416((uint)(fVar82 * 2.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 3.5)),auVar105,0xf8);
  auVar70 = ZEXT416((uint)(fVar82 * 3.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 4.5)),auVar105,0xf8);
  auVar71 = ZEXT416((uint)(fVar82 * 4.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 5.5)),auVar105,0xf8);
  auVar72 = ZEXT416((uint)(fVar82 * 5.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 6.5)),auVar105,0xf8);
  auVar73 = ZEXT416((uint)(fVar82 * 6.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 7.5)),auVar105,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + fVar82 * 7.5));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 8.5)),auVar105,0xf8);
  auVar75 = ZEXT416((uint)(fVar82 * 8.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 9.5)),auVar105,0xf8);
  auVar76 = ZEXT416((uint)(fVar82 * 9.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 10.5)),auVar105,0xf8);
  auVar77 = ZEXT416((uint)(fVar82 * 10.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar82 * 11.5)),auVar105,0xf8);
  auVar78 = ZEXT416((uint)(fVar82 * 11.5 + auVar78._0_4_));
  auVar78 = vroundss_avx(auVar78,auVar78,0xb);
  fVar87 = auVar69._0_4_;
  fVar82 = fVar87 + auVar68._0_4_;
  fVar8 = fVar87 + auVar67._0_4_;
  fVar7 = fVar87 - auVar67._0_4_;
  fVar81 = fVar87 - auVar68._0_4_;
  fVar100 = fVar87 - auVar70._0_4_;
  fVar9 = fVar87 - auVar71._0_4_;
  fVar10 = fVar87 - auVar72._0_4_;
  fVar87 = fVar87 - auVar73._0_4_;
  fVar102 = auVar74._0_4_;
  fVar11 = fVar102 - auVar70._0_4_;
  fVar12 = fVar102 - auVar71._0_4_;
  fVar13 = fVar102 - auVar72._0_4_;
  fVar14 = fVar102 - auVar73._0_4_;
  fVar15 = fVar102 - auVar75._0_4_;
  fVar16 = fVar102 - auVar76._0_4_;
  fVar17 = fVar102 - auVar77._0_4_;
  fVar102 = fVar102 - auVar78._0_4_;
  gauss_s1_c0[0] = expf(fVar82 * fVar82 * fVar80);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar80);
  gauss_s1_c0[2] = expf(fVar7 * fVar7 * fVar80);
  gauss_s1_c0[3] = expf(fVar81 * fVar81 * fVar80);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar100 * fVar100 * fVar80);
  gauss_s1_c0[6] = expf(fVar9 * fVar9 * fVar80);
  gauss_s1_c0[7] = expf(fVar10 * fVar10 * fVar80);
  gauss_s1_c0[8] = expf(fVar87 * fVar87 * fVar80);
  gauss_s1_c1[0] = expf(fVar11 * fVar11 * fVar80);
  gauss_s1_c1[1] = expf(fVar12 * fVar12 * fVar80);
  gauss_s1_c1[2] = expf(fVar13 * fVar13 * fVar80);
  gauss_s1_c1[3] = expf(fVar14 * fVar14 * fVar80);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar15 * fVar15 * fVar80);
  gauss_s1_c1[6] = expf(fVar16 * fVar16 * fVar80);
  gauss_s1_c1[7] = expf(fVar17 * fVar17 * fVar80);
  gauss_s1_c1[8] = expf(fVar102 * fVar102 * fVar80);
  uVar29 = 0xfffffff8;
  lVar58 = 0;
  fVar82 = 0.0;
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  lVar57 = 0;
  lVar53 = 0;
  do {
    pfVar51 = gauss_s1_c1;
    uVar27 = (uint)uVar29;
    if (uVar27 != 7) {
      pfVar51 = gauss_s1_c0;
    }
    if (uVar27 == 0xfffffff8) {
      pfVar51 = gauss_s1_c1;
    }
    lVar57 = (long)(int)lVar57;
    iVar44 = (int)lVar53;
    lVar53 = (long)iVar44;
    lVar49 = (long)haarResponseX + lVar58;
    lVar38 = (long)haarResponseY + lVar58;
    uVar46 = 0xfffffff8;
    uVar66 = 0;
    do {
      pfVar52 = gauss_s1_c1;
      if (uVar46 != 7) {
        pfVar52 = gauss_s1_c0;
      }
      if (uVar46 == 0xfffffff8) {
        pfVar52 = gauss_s1_c1;
      }
      uVar30 = (ulong)(uVar46 >> 0x1c & 0xfffffff8);
      auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar35 = uVar66;
      lVar59 = lVar49;
      lVar61 = lVar38;
      do {
        lVar54 = 0;
        pfVar47 = (float *)((long)pfVar51 + (ulong)(uint)((int)(uVar29 >> 0x1f) << 5));
        do {
          fVar8 = pfVar52[uVar30] * *pfVar47;
          auVar67 = vinsertps_avx(ZEXT416(*(uint *)(lVar61 + lVar54 * 4)),
                                  ZEXT416(*(uint *)(lVar59 + lVar54 * 4)),0x10);
          auVar99._0_4_ = fVar8 * auVar67._0_4_;
          auVar99._4_4_ = fVar8 * auVar67._4_4_;
          auVar99._8_4_ = fVar8 * auVar67._8_4_;
          auVar99._12_4_ = fVar8 * auVar67._12_4_;
          auVar67 = vandps_avx(auVar99,auVar86);
          auVar67 = vmovlhps_avx(auVar99,auVar67);
          auVar89._0_4_ = auVar103._0_4_ + auVar67._0_4_;
          auVar89._4_4_ = auVar103._4_4_ + auVar67._4_4_;
          auVar89._8_4_ = auVar103._8_4_ + auVar67._8_4_;
          auVar89._12_4_ = auVar103._12_4_ + auVar67._12_4_;
          auVar103 = ZEXT1664(auVar89);
          pfVar47 = pfVar47 + (ulong)(~uVar27 >> 0x1f) * 2 + -1;
          lVar54 = lVar54 + 1;
        } while (lVar54 != 9);
        uVar35 = uVar35 + 0x18;
        uVar30 = uVar30 + (ulong)(-1 < (int)uVar46) * 2 + -1;
        lVar59 = lVar59 + 0x60;
        lVar61 = lVar61 + 0x60;
      } while (uVar35 < uVar46 * 0x18 + 0x198);
      fVar8 = gauss_s2_arr[lVar53];
      auVar20._4_4_ = fVar8;
      auVar20._0_4_ = fVar8;
      auVar20._8_4_ = fVar8;
      auVar20._12_4_ = fVar8;
      auVar69 = vmulps_avx512vl(auVar89,auVar20);
      lVar53 = lVar53 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar57) = auVar69;
      auVar91._0_4_ = auVar69._0_4_ * auVar69._0_4_;
      auVar91._4_4_ = auVar69._4_4_ * auVar69._4_4_;
      auVar91._8_4_ = auVar69._8_4_ * auVar69._8_4_;
      auVar91._12_4_ = auVar69._12_4_ * auVar69._12_4_;
      auVar67 = vmovshdup_avx(auVar91);
      auVar68 = vfmadd231ss_fma(auVar67,auVar69,auVar69);
      auVar67 = vshufpd_avx(auVar69,auVar69,1);
      auVar68 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      auVar67 = vshufps_avx(auVar69,auVar69,0xff);
      auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      fVar82 = fVar82 + auVar67._0_4_;
      lVar57 = lVar57 + 4;
      uVar46 = uVar46 + 5;
      uVar66 = uVar66 + 0x78;
      lVar49 = lVar49 + 0x1e0;
      lVar38 = lVar38 + 0x1e0;
    } while (iVar44 + 4 != (int)lVar53);
    lVar58 = lVar58 + 0x14;
    uVar29 = (ulong)(uVar27 + 5);
  } while ((int)uVar27 < 3);
  if (fVar82 < 0.0) {
    fVar82 = sqrtf(fVar82);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
    fVar82 = auVar67._0_4_;
  }
  auVar103 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar82)));
  lVar58 = 0;
  do {
    auVar107 = vmulps_avx512f(auVar103,*(undefined1 (*) [64])(ipoint->descriptor + lVar58));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar58) = auVar107;
    lVar58 = lVar58 + 0x10;
  } while (lVar58 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_2_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}